

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

mbedtls_ssl_ciphersuite_t * mbedtls_ssl_ciphersuite_from_string(char *ciphersuite_name)

{
  int iVar1;
  mbedtls_ssl_ciphersuite_t *local_20;
  mbedtls_ssl_ciphersuite_t *cur;
  char *ciphersuite_name_local;
  
  local_20 = ciphersuite_definitions;
  if (ciphersuite_name != (char *)0x0) {
    for (; local_20->id != 0; local_20 = local_20 + 1) {
      iVar1 = strcmp(local_20->name,ciphersuite_name);
      if (iVar1 == 0) {
        return local_20;
      }
    }
  }
  return (mbedtls_ssl_ciphersuite_t *)0x0;
}

Assistant:

const mbedtls_ssl_ciphersuite_t *mbedtls_ssl_ciphersuite_from_string(
    const char *ciphersuite_name)
{
    const mbedtls_ssl_ciphersuite_t *cur = ciphersuite_definitions;

    if (NULL == ciphersuite_name) {
        return NULL;
    }

    while (cur->id != 0) {
        if (0 == strcmp(cur->name, ciphersuite_name)) {
            return cur;
        }

        cur++;
    }

    return NULL;
}